

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

bool toml::detail::skip_whitespace<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  byte bVar1;
  context<toml::type_config> *in_RSI;
  location *in_stack_000000d0;
  repeat_at_least *in_stack_000000d8;
  undefined7 in_stack_ffffffffffffff50;
  spec *in_stack_ffffffffffffff88;
  
  context<toml::type_config>::toml_spec(in_RSI);
  syntax::ws(in_stack_ffffffffffffff88);
  repeat_at_least::scan(in_stack_000000d8,in_stack_000000d0);
  bVar1 = region::is_ok((region *)0x64fa29);
  region::~region((region *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  repeat_at_least::~repeat_at_least((repeat_at_least *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  return (bool)(bVar1 & 1);
}

Assistant:

bool skip_whitespace(location& loc, const context<TC>& ctx)
{
    return syntax::ws(ctx.toml_spec()).scan(loc).is_ok();
}